

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_scc(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGv_i32 ret;
  TCGv_i32 pTVar1;
  TCGv_i32 ea_result;
  TCGv_i32 tmp;
  undefined1 local_40 [4];
  int cond;
  DisasCompare_conflict c;
  TCGContext_conflict2 *tcg_ctx;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  c.v2 = (TCGv_i32)s->uc->tcg_ctx;
  gen_cc_cond((DisasCompare_conflict *)local_40,s,(int)(uint)insn >> 8 & 0xf);
  ret = tcg_temp_new_i32((TCGContext_conflict2 *)c.v2);
  tcg_gen_setcond_i32_m68k
            ((TCGContext_conflict2 *)c.v2,(TCGCond)local_40,ret,(TCGv_i32)c._0_8_,c.v1);
  free_cond((TCGContext_conflict2 *)c.v2,(DisasCompare_conflict *)local_40);
  tcg_gen_neg_i32((TCGContext_conflict2 *)c.v2,ret,ret);
  pTVar1 = gen_ea(env,s,insn,0,ret,(TCGv_i32 *)0x0,EA_STORE,
                  (uint)(((((s->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
  if (pTVar1 == *(TCGv_i32 *)(c.v2 + 0x94f8)) {
    gen_addr_fault(s);
  }
  else {
    tcg_temp_free_i32((TCGContext_conflict2 *)c.v2,ret);
  }
  return;
}

Assistant:

DISAS_INSN(scc)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    DisasCompare c;
    int cond;
    TCGv tmp;

    cond = (insn >> 8) & 0xf;
    gen_cc_cond(&c, s, cond);

    tmp = tcg_temp_new(tcg_ctx);
    tcg_gen_setcond_i32(tcg_ctx, c.tcond, tmp, c.v1, c.v2);
    free_cond(tcg_ctx, &c);

    tcg_gen_neg_i32(tcg_ctx, tmp, tmp);
    DEST_EA(env, insn, OS_BYTE, tmp, NULL);
    tcg_temp_free(tcg_ctx, tmp);
}